

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O1

ClipResult __thiscall Text::clip_position(Text *this,Point position)

{
  pointer puVar1;
  pointer puVar2;
  ClipResult CVar3;
  uint uVar4;
  uint column;
  ulong uVar5;
  uint uVar6;
  uint row;
  ulong uVar7;
  Point local_28;
  uint local_20;
  
  row = position.row;
  uVar5 = (ulong)position & 0xffffffff;
  puVar1 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  if (uVar5 < uVar7) {
    if (uVar5 == uVar7 - 1) {
      uVar6 = (uint)(this->content)._M_string_length;
    }
    else {
      uVar6 = puVar1[row + 1] - 1;
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar4 = puVar1[row + 1] - 2;
        if ((this->content)._M_dataplus._M_p[uVar4] == L'\r') {
          uVar6 = uVar4;
        }
      }
    }
    column = uVar6 - puVar1[uVar5];
    uVar4 = position.column;
    if (column < uVar4) {
      Point::Point(&local_28,row,column);
      local_20 = uVar6;
    }
    else {
      local_20 = puVar1[uVar5] + uVar4;
      local_28.row = row;
      local_28.column = uVar4;
    }
  }
  else {
    puVar2 = (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    Point::Point(&local_28,(int)((ulong)((long)puVar2 - (long)puVar1) >> 2) - 1,
                 (int)(this->content)._M_string_length - puVar2[-1]);
    local_20 = (uint)(this->content)._M_string_length;
  }
  CVar3.position.column = local_28.column;
  CVar3.position.row = local_28.row;
  CVar3.offset = local_20;
  return CVar3;
}

Assistant:

ClipResult Text::clip_position(Point position) const {
  uint32_t row = position.row;
  if (row >= line_offsets.size()) {
    return {extent(), size()};
  } else {
    uint32_t start = line_offsets[row];
    uint32_t end;
    if (row == line_offsets.size() - 1) {
      end = content.size();
    } else {
      end = line_offsets[row + 1] - 1;
      if (end > 0 && content[end - 1] == '\r') {
        end--;
      }
    }
    if (position.column > end - start) {
      return {Point(row, end - start), end};
    } else {
      return {position, start + position.column};
    }
  }
}